

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffverifydate(int year,int month,int day,int *status)

{
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  char errmsg [81];
  int ndays [13];
  char acStack_b8 [96];
  int local_58 [16];
  int *local_18;
  uint local_10;
  uint local_c;
  uint local_8;
  int local_4;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  memcpy(local_58,&DAT_00307380,0x34);
  if (((int)local_8 < 0) || (9999 < (int)local_8)) {
    snprintf(acStack_b8,0x51,"input year value = %d is out of range 0 - 9999",(ulong)local_8);
    ffpmsg((char *)0x254306);
    *local_18 = 0x1a4;
    local_4 = 0x1a4;
  }
  else if (((int)local_c < 1) || (0xc < (int)local_c)) {
    snprintf(acStack_b8,0x51,"input month value = %d is out of range 1 - 12",(ulong)local_c);
    ffpmsg((char *)0x25435d);
    *local_18 = 0x1a4;
    local_4 = 0x1a4;
  }
  else {
    if (local_58[(int)local_c] == 0x1f) {
      if (((int)local_10 < 1) || (0x1f < (int)local_10)) {
        snprintf(acStack_b8,0x51,"input day value = %d is out of range 1 - 31 for month %d",
                 (ulong)local_10,(ulong)local_c);
        ffpmsg((char *)0x2543cd);
        *local_18 = 0x1a4;
        return 0x1a4;
      }
    }
    else if (local_58[(int)local_c] == 0x1e) {
      if (((int)local_10 < 1) || (0x1e < (int)local_10)) {
        snprintf(acStack_b8,0x51,"input day value = %d is out of range 1 - 30 for month %d",
                 (ulong)local_10,(ulong)local_c);
        ffpmsg((char *)0x254440);
        *local_18 = 0x1a4;
        return 0x1a4;
      }
    }
    else if (((int)local_10 < 1) || (0x1c < (int)local_10)) {
      if (local_10 == 0x1d) {
        if ((((int)local_8 % 4 == 0) && ((int)local_8 % 100 != 0)) || ((int)local_8 % 400 == 0)) {
          return *local_18;
        }
        snprintf(acStack_b8,0x51,
                 "input day value = %d is out of range 1 - 28 for February %d (not leap year)",0x1d,
                 (ulong)local_8);
        ffpmsg((char *)0x254508);
      }
      else {
        snprintf(acStack_b8,0x51,"input day value = %d is out of range 1 - 28 (or 29) for February",
                 (ulong)local_10);
        ffpmsg((char *)0x25452f);
      }
      *local_18 = 0x1a4;
      return 0x1a4;
    }
    local_4 = *local_18;
  }
  return local_4;
}

Assistant:

int ffverifydate(int year,          /* I - year (0 - 9999)           */
                 int month,         /* I - month (1 - 12)            */
                 int day,           /* I - day (1 - 31)              */
                 int   *status)     /* IO - error status             */
/*
  Verify that the date is valid
*/
{
    int ndays[] = {0,31,28,31,30,31,30,31,31,30,31,30,31};
    char errmsg[FLEN_ERRMSG];
    

    if (year < 0 || year > 9999)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input year value = %d is out of range 0 - 9999", year);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (month < 1 || month > 12)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input month value = %d is out of range 1 - 12", month);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    
    if (ndays[month] == 31) {
        if (day < 1 || day > 31)
        {
           snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 31 for month %d", day, month);
           ffpmsg(errmsg);
           return(*status = BAD_DATE);
        }
    } else if (ndays[month] == 30) {
        if (day < 1 || day > 30)
        {
           snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 30 for month %d", day, month);
           ffpmsg(errmsg);
           return(*status = BAD_DATE);
        }
    } else {
        if (day < 1 || day > 28)
        {
            if (day == 29)
            {
	      /* year is a leap year if it is divisible by 4 but not by 100,
	         except years divisible by 400 are leap years
	      */
	        if ((year % 4 == 0 && year % 100 != 0 ) || year % 400 == 0)
		   return (*status);
		   
 	        snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 28 for February %d (not leap year)", day, year);
                ffpmsg(errmsg);
	    } else {
                snprintf(errmsg, FLEN_ERRMSG,
                "input day value = %d is out of range 1 - 28 (or 29) for February", day);
                ffpmsg(errmsg);
	    }
	    
            return(*status = BAD_DATE);
        }
    }
    return(*status);
}